

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase112::run(TestCase112 *this)

{
  Reader reader;
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  int chainedCallCount;
  int callCount;
  int local_29c;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  WaitScope waitScope;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  Client client;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  EventLoop loop;
  Maybe<capnp::MessageSize> local_68;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> local_38;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  callCount = 0;
  chainedCallCount = 0;
  kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&response,&callCount);
  capnproto_test::capnp::test::TestPipeline::Client::Client<capnp::_::TestPipelineImpl,void>
            (&client,(Own<capnp::_::TestPipelineImpl> *)&response);
  kj::Own<capnp::_::TestPipelineImpl>::dispose((Own<capnp::_::TestPipelineImpl> *)&response);
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest(&request,&client,&local_38);
  *(undefined4 *)request.super_Builder._builder.data = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&response2,&chainedCallCount);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&response,(Own<capnp::_::TestInterfaceImpl> *)&response2);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setInCap
            (&request.super_Builder,(Client *)&response);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&response.super_Reader._reader.capTable);
  kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)&response2);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)&promise,(int)&request,__buf,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            ((Pipeline *)&response,&promise.super_Pipeline);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&response2,(Pipeline *)&response);
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&pipelineRequest,(Client *)&response2,&local_50);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&response2.super_Reader._reader.capTable);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response);
  *(undefined4 *)pipelineRequest.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&pipelinePromise,(int)&pipelineRequest,__buf_00,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            ((Pipeline *)&response,&promise.super_Pipeline);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&pipelinePromise2,(Pipeline *)&response);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            ((Client *)&response2,
             (Client *)
             ((long)&pipelinePromise2.
                     super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
                     super_PromiseBase.node.disposer +
             (long)pipelinePromise2.
                   super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
                   super_PromiseBase.node.disposer[-3]._vptr_Disposer));
  local_68.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&pipelineRequest2,(Client *)&response2,&local_68);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&response2.super_Reader._reader.capTable);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)
             &pipelinePromise2.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
              super_PromiseBase.node.ptr);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)&pipelinePromise2,(int)&pipelineRequest2,__buf_01,in_RCX,in_R8D);
  response.super_Reader._reader.dataSize = 0;
  response.super_Reader._reader.pointerCount = 0;
  response.super_Reader._reader._38_2_ = 0;
  response.super_Reader._reader.nestingLimit = 0;
  response.super_Reader._reader._44_4_ = 0;
  response.super_Reader._reader.data = (void *)0x0;
  response.super_Reader._reader.pointers = (WirePointer *)0x0;
  response.super_Reader._reader.segment = (SegmentReader *)0x0;
  response.super_Reader._reader.capTable = (CapTableReader *)0x0;
  response.hook.disposer = (Disposer *)0x0;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            (&promise,(RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
                      &response);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)&response);
  if (callCount != 0 && kj::_::Debug::minSeverity < 3) {
    response.super_Reader._reader.segment =
         (SegmentReader *)((ulong)response.super_Reader._reader.segment & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x87,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response,&callCount);
  }
  if ((chainedCallCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    response.super_Reader._reader.segment =
         (SegmentReader *)((ulong)response.super_Reader._reader.segment & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(0) == (chainedCallCount)\", 0, chainedCallCount",
               (char (*) [43])"failed: expected (0) == (chainedCallCount)",(int *)&response,
               &chainedCallCount);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response,&pipelinePromise);
  response2.super_Reader._reader._0_16_ =
       capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX(&response.super_Reader);
  bVar1 = kj::operator==("bar",(StringPtr *)&response2);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    response2.super_Reader._reader._0_16_ =
         capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                   (&response.super_Reader);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x8b,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", \"bar\", response.getX()"
               ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
               (char (*) [4])0x501447,(Reader *)&response2);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&response2,
             &pipelinePromise2);
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader.nestingLimit = response2.super_Reader._reader.nestingLimit;
  reader._reader._44_4_ = response2.super_Reader._reader._44_4_;
  checkTestMessage(reader);
  if (callCount != 3 && kj::_::Debug::minSeverity < 3) {
    local_29c = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x90,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",&local_29c,&callCount);
  }
  if ((chainedCallCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_29c = 1;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(1) == (chainedCallCount)\", 1, chainedCallCount",
               (char (*) [43])"failed: expected (1) == (chainedCallCount)",&local_29c,
               &chainedCallCount);
  }
  kj::Own<capnp::ResponseHook>::dispose(&response2.hook);
  kj::Own<capnp::ResponseHook>::dispose(&response.hook);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise(&pipelinePromise2);
  kj::Own<capnp::RequestHook>::dispose(&pipelineRequest2.hook);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            (&pipelinePromise);
  kj::Own<capnp::RequestHook>::dispose(&pipelineRequest.hook);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise(&promise);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, Pipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  test::TestPipeline::Client client(kj::heap<TestPipelineImpl>(callCount));

  auto request = client.getCapRequest();
  request.setN(234);
  request.setInCap(test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
  pipelineRequest.setI(321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = promise.getOutBox().getCap().castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.getX());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}